

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pizza_cutter.cpp
# Opt level: O1

optional<pizza_slice> * __thiscall
pizza_cutter::create_slice_for
          (optional<pizza_slice> *__return_storage_ptr__,pizza_cutter *this,int row,int col)

{
  int iVar1;
  int iVar2;
  pointer pvVar3;
  byte bVar4;
  int iVar5;
  bool bVar6;
  pointer pvVar7;
  long lVar8;
  bool bVar9;
  pizza_slice ps;
  pizza_slice ps_00;
  uint local_74;
  ulong local_68;
  int local_58;
  int local_54;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  
  local_68 = (ulong)(uint)col;
  if (*(int *)(*(long *)&(this->pizza_).
                         super__Vector_base<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[row].
                         super__Vector_base<pizza_cell,_std::allocator<pizza_cell>_>._M_impl.
                         super__Vector_impl_data + 4 + (long)col * 8) == -1) {
    pvVar7 = (pointer)CONCAT44(col,row);
    iVar1 = this->max_total_;
    iVar2 = this->min_each_;
    bVar6 = true;
    local_74 = row;
    do {
      if (!bVar6) goto LAB_00103202;
      local_38 = (pointer)((ulong)local_74 | local_68 << 0x20);
      bVar4 = 1;
      bVar9 = false;
      lVar8 = 0;
      local_40 = pvVar7;
      do {
        ps._8_8_ = pvVar7;
        ps._0_8_ = local_38;
        extend_slice(__return_storage_ptr__,this,ps,
                     *(direction *)((long)directions._M_elems + lVar8));
        if ((__return_storage_ptr__->super__Optional_base<pizza_slice,_true,_true>)._M_payload.
            super__Optional_payload_base<pizza_slice>._M_engaged == true) {
          pvVar7 = *(pointer *)
                    &(__return_storage_ptr__->super__Optional_base<pizza_slice,_true,_true>).
                     _M_payload.super__Optional_payload_base<pizza_slice>._M_payload;
          pvVar3 = *(pointer *)
                    ((long)&(__return_storage_ptr__->super__Optional_base<pizza_slice,_true,_true>).
                            _M_payload.super__Optional_payload_base<pizza_slice>._M_payload + 8);
          ps_00._8_8_ = pvVar7;
          ps_00._0_8_ = this;
          count_ingredients((pizza_cutter *)&local_58,ps_00);
          iVar5 = 5;
          if (local_58 + local_54 <= iVar1) {
            iVar5 = 0;
            if (local_54 < iVar2 || local_58 < iVar2) {
              bVar4 = 0;
              local_50 = pvVar3;
              local_48 = pvVar7;
            }
            else {
              iVar5 = 1;
              bVar4 = 0;
            }
          }
          bVar9 = true;
          pvVar7 = local_40;
        }
        else {
          iVar5 = 0;
        }
        if ((iVar5 != 5) && (iVar5 != 0)) goto LAB_00103328;
        lVar8 = lVar8 + 4;
      } while (lVar8 != 0x10);
      iVar5 = 4;
LAB_00103328:
      if (iVar5 == 4) {
        local_68 = (ulong)local_48 >> 0x20;
        bVar6 = (bool)(bVar4 ^ 1);
        iVar5 = 0;
        if (!bVar9) {
          bVar6 = false;
        }
        local_74 = (uint)local_48;
        pvVar7 = local_50;
      }
    } while (iVar5 == 0);
  }
  else {
LAB_00103202:
    (__return_storage_ptr__->super__Optional_base<pizza_slice,_true,_true>)._M_payload.
    super__Optional_payload_base<pizza_slice>._M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<pizza_slice> pizza_cutter::create_slice_for(int row, int col) const noexcept
{
    if (pizza_[row][col].owner != -1) return std::nullopt;

    pizza_slice slice{row, col, row, col};

    bool look_for_next = true;
    while (look_for_next) {
        bool could_be_extended = false;
        bool all_is_too_large = true;

        pizza_slice candidate;
        for (auto d : directions) {
            auto new_slice = extend_slice(slice, d);

            if (new_slice) {
                could_be_extended = true;
                auto [mushrooms, tomatoes] = count_ingredients(new_slice.value());

                if (is_too_large(mushrooms, tomatoes))
                    continue;

                all_is_too_large = false;

                if (is_minimum_ingredients(mushrooms, tomatoes))
                    return new_slice;

                candidate = new_slice.value();
            }
        }
        slice = candidate;
        look_for_next = could_be_extended && !all_is_too_large;
    }

    return std::nullopt;
}